

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qguiapplication.cpp
# Opt level: O3

bool __thiscall QGuiApplicationPrivate::lastWindowClosed(QGuiApplicationPrivate *this)

{
  char cVar1;
  iterator iVar2;
  iterator iVar3;
  QWindowPrivate *pQVar4;
  bool bVar5;
  long in_FS_OFFSET;
  QList<QWindow_*> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QGuiApplication::topLevelWindows();
  iVar2 = QList<QWindow_*>::begin(&local_40);
  iVar3 = QList<QWindow_*>::end(&local_40);
  bVar5 = true;
  do {
    if (iVar2.i == iVar3.i) {
LAB_002d79e6:
      if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,8,0x10);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return bVar5;
      }
      __stack_chk_fail();
    }
    pQVar4 = qt_window_private(*iVar2.i);
    cVar1 = (**(code **)(*(long *)pQVar4 + 0x50))(pQVar4);
    if ((cVar1 != '\0') && (cVar1 = (**(code **)(*(long *)pQVar4 + 0x58))(pQVar4), cVar1 != '\0')) {
      bVar5 = false;
      goto LAB_002d79e6;
    }
    iVar2.i = iVar2.i + 1;
  } while( true );
}

Assistant:

bool QGuiApplicationPrivate::lastWindowClosed() const
{
    for (auto *window : QGuiApplication::topLevelWindows()) {
        auto *windowPrivate = qt_window_private(window);
        if (!windowPrivate->participatesInLastWindowClosed())
            continue;

        if (windowPrivate->treatAsVisible())
            return false;
     }

     return true;
}